

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lda_x.c
# Opt level: O0

void N_set_ext_params(xc_func_type *p,double *ext_params)

{
  double *pdVar1;
  double *in_RSI;
  xc_func_type *in_RDI;
  double dVar2;
  double dVar3;
  double dx2;
  double dx;
  double N;
  lda_x_params *params;
  
  pdVar1 = (double *)in_RDI->params;
  dVar2 = get_ext_param(in_RDI,in_RSI,0);
  dVar2 = cbrt(dVar2 * 4.0);
  dVar2 = 1.0 / dVar2;
  dVar3 = dVar2 * dVar2;
  *pdVar1 = (dVar3 + dVar3 + dVar2 * -2.6666666666666665 + 1.0) - (dVar3 * dVar3) / 3.0;
  return;
}

Assistant:

static void
N_set_ext_params(xc_func_type *p, const double *ext_params)
{
  lda_x_params *params;
  double N, dx, dx2;

  assert(p != NULL && p->params != NULL);
  params = (lda_x_params *)(p->params);

  N = get_ext_param(p, ext_params, 0);

  dx  = 1.0/CBRT(4.0*N);
  dx2 = dx*dx;
  params->alpha = 1.0 - 8.0/3.0*dx + 2.0*dx2 - dx2*dx2/3.0;
}